

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_grow_and_rehash(JSON_Object *object)

{
  JSON_Value *value_00;
  JSON_Status JVar1;
  size_t local_98;
  JSON_Status res;
  size_t new_capacity;
  uint i;
  JSON_Value *value;
  char *key;
  JSON_Object new_object;
  JSON_Value *wrapping_value;
  JSON_Object *object_local;
  
  new_object.cell_capacity = 0;
  if (object->cell_capacity * 2 < 0x11) {
    local_98 = 0x10;
  }
  else {
    local_98 = object->cell_capacity << 1;
  }
  JVar1 = json_object_init((JSON_Object *)&key,local_98);
  if (JVar1 == 0) {
    key = (char *)json_object_get_wrapping_value(object);
    new_object.cell_capacity = (size_t)key;
    for (new_capacity._4_4_ = 0; (ulong)new_capacity._4_4_ < object->count;
        new_capacity._4_4_ = new_capacity._4_4_ + 1) {
      value_00 = object->values[new_capacity._4_4_];
      JVar1 = json_object_add((JSON_Object *)&key,object->names[new_capacity._4_4_],value_00);
      if (JVar1 != 0) {
        json_object_deinit((JSON_Object *)&key,0,0);
        return -1;
      }
      value_00->parent = (JSON_Value *)new_object.cell_capacity;
    }
    json_object_deinit(object,0,0);
    memcpy(object,&key,0x48);
    object_local._4_4_ = 0;
  }
  else {
    object_local._4_4_ = -1;
  }
  return object_local._4_4_;
}

Assistant:

static JSON_Status json_object_grow_and_rehash(JSON_Object *object) {
    JSON_Value *wrapping_value = NULL;
    JSON_Object new_object;
    char *key = NULL;
    JSON_Value *value = NULL;
    unsigned int i = 0;
    size_t new_capacity = MAX(object->cell_capacity * 2, STARTING_CAPACITY);
    JSON_Status res = json_object_init(&new_object, new_capacity);
    if (res != JSONSuccess) {
        return JSONFailure;
    }

    wrapping_value = json_object_get_wrapping_value(object);
    new_object.wrapping_value = wrapping_value;

    for (i = 0; i < object->count; i++) {
        key = object->names[i];
        value = object->values[i];
        res = json_object_add(&new_object, key, value);
        if (res != JSONSuccess) {
            json_object_deinit(&new_object, PARSON_FALSE, PARSON_FALSE);
            return JSONFailure;
        }
        value->parent = wrapping_value;
    }
    json_object_deinit(object, PARSON_FALSE, PARSON_FALSE);
    *object = new_object;
    return JSONSuccess;
}